

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::emit_complex_bitcast
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t op0)

{
  int iVar1;
  int iVar2;
  bool forwarding;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  char (*in_R8) [3];
  bool bVar5;
  string sStack_88;
  string expr;
  string local_48;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  pSVar4 = Compiler::expression_type(&this->super_Compiler,op0);
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
  iVar2 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  if (pSVar4->vecsize == 1 && (iVar2 == 0xd && iVar1 == 0xc)) {
    to_unpacked_expression_abi_cxx11_(&sStack_88,this,op0,true);
    join<char_const(&)[33],std::__cxx11::string,char_const(&)[3]>
              (&local_48,(spirv_cross *)"unpackFloat2x16(floatBitsToUint(",(char (*) [33])&sStack_88
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31a9b3,in_R8)
    ;
  }
  else {
    if (pSVar4->vecsize != 2 || (iVar2 != 0xc || iVar1 != 0xd)) {
      bVar5 = false;
      goto LAB_0021870a;
    }
    to_unpacked_expression_abi_cxx11_(&sStack_88,this,op0,true);
    join<char_const(&)[31],std::__cxx11::string,char_const(&)[3]>
              (&local_48,(spirv_cross *)"uintBitsToFloat(packFloat2x16(",(char (*) [31])&sStack_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31a9b3,in_R8);
  }
  ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&sStack_88);
  forwarding = should_forward(this,op0);
  bVar5 = true;
  emit_op(this,result_type,id,&expr,forwarding,false);
LAB_0021870a:
  ::std::__cxx11::string::~string((string *)&expr);
  return bVar5;
}

Assistant:

bool CompilerGLSL::emit_complex_bitcast(uint32_t result_type, uint32_t id, uint32_t op0)
{
	// Some bitcasts may require complex casting sequences, and are implemented here.
	// Otherwise a simply unary function will do with bitcast_glsl_op.

	auto &output_type = get<SPIRType>(result_type);
	auto &input_type = expression_type(op0);
	string expr;

	if (output_type.basetype == SPIRType::Half && input_type.basetype == SPIRType::Float && input_type.vecsize == 1)
		expr = join("unpackFloat2x16(floatBitsToUint(", to_unpacked_expression(op0), "))");
	else if (output_type.basetype == SPIRType::Float && input_type.basetype == SPIRType::Half &&
	         input_type.vecsize == 2)
		expr = join("uintBitsToFloat(packFloat2x16(", to_unpacked_expression(op0), "))");
	else
		return false;

	emit_op(result_type, id, expr, should_forward(op0));
	return true;
}